

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_atomize(char *expr,lys_node *cur_snode,lyxp_node_type cur_snode_type,lyxp_set *set,
                int options,lys_node **ctx_snode)

{
  lyxp_expr *exp_00;
  lys_node *cur_node;
  lys_module *plVar1;
  int local_58;
  uint16_t local_52;
  int rc;
  uint16_t exp_idx;
  lyxp_expr *exp;
  lys_node *plStack_40;
  lyxp_node_type ctx_snode_type;
  lys_node *_ctx_snode;
  lys_node **ctx_snode_local;
  lyxp_set *plStack_28;
  int options_local;
  lyxp_set *set_local;
  lys_node *plStack_18;
  lyxp_node_type cur_snode_type_local;
  lys_node *cur_snode_local;
  char *expr_local;
  
  local_52 = 0;
  _ctx_snode = (lys_node *)ctx_snode;
  ctx_snode_local._4_4_ = options;
  plStack_28 = set;
  set_local._4_4_ = cur_snode_type;
  plStack_18 = cur_snode;
  cur_snode_local = (lys_node *)expr;
  _rc = lyxp_parse_expr(cur_snode->module->ctx,expr);
  if (_rc == (lyxp_expr *)0x0) {
    local_58 = -1;
  }
  else {
    local_58 = reparse_or_expr(plStack_18->module->ctx,_rc,&local_52);
    if (local_58 == 0) {
      if (local_52 < _rc->used) {
        ly_vlog(plStack_18->module->ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                _rc->expr + _rc->expr_pos[local_52]);
        ly_vlog(plStack_18->module->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Unparsed characters \"%s\" left at the end of an XPath expression.",
                _rc->expr + _rc->expr_pos[local_52]);
        local_58 = -1;
      }
      else {
        print_expr_struct_debug(_rc);
        if ((ctx_snode_local._4_4_ & 0x10) == 0) {
          plStack_40 = plStack_18;
          exp._4_4_ = set_local._4_4_;
        }
        else {
          resolve_when_ctx_snode
                    (plStack_18,&stack0xffffffffffffffc0,(lyxp_node_type *)((long)&exp + 4));
        }
        if (_ctx_snode != (lys_node *)0x0) {
          _ctx_snode->name = (char *)plStack_40;
        }
        local_52 = 0;
        memset(plStack_28,0,0x40);
        plStack_28->type = LYXP_SET_SNODE_SET;
        set_snode_insert_node(plStack_28,plStack_40,exp._4_4_);
        cur_node = plStack_40;
        exp_00 = _rc;
        plVar1 = lys_node_module(plStack_40);
        local_58 = eval_expr_select(exp_00,&local_52,LYXP_EXPR_NONE,(lyd_node *)cur_node,plVar1,
                                    plStack_28,ctx_snode_local._4_4_);
        if (local_58 == 2) {
          local_58 = 0;
        }
      }
    }
  }
  lyxp_expr_free(_rc);
  return local_58;
}

Assistant:

int
lyxp_atomize(const char *expr, const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type,
             struct lyxp_set *set, int options, const struct lys_node **ctx_snode)
{
    struct lys_node *_ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    exp = lyxp_parse_expr(cur_snode->module->ctx, expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_or_expr(cur_snode->module->ctx, exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(cur_snode->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(cur_snode->module->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    if (options & LYXP_SNODE_WHEN) {
        /* for when the context node may need to be changed */
        resolve_when_ctx_snode(cur_snode, &_ctx_snode, &ctx_snode_type);
    } else {
        _ctx_snode = (struct lys_node *)cur_snode;
        ctx_snode_type = cur_snode_type;
    }

    if (ctx_snode) {
        *ctx_snode = _ctx_snode;
    }

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_SNODE_SET;
    set_snode_insert_node(set, _ctx_snode, ctx_snode_type);

    rc = eval_expr_select(exp, &exp_idx, 0, (struct lyd_node *)_ctx_snode, lys_node_module(_ctx_snode), set, options);
    if (rc == 2) {
        rc = EXIT_SUCCESS;
    }

finish:
    lyxp_expr_free(exp);
    return rc;
}